

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

void act_var_rescale(sat_solver2 *s)

{
  uint *puVar1;
  int iVar2;
  int local_1c;
  int i;
  uint *activity;
  sat_solver2 *s_local;
  
  puVar1 = s->activity;
  for (local_1c = 0; local_1c < s->size; local_1c = local_1c + 1) {
    puVar1[local_1c] = puVar1[local_1c] >> 0x13;
  }
  s->var_inc = s->var_inc >> 0x13;
  iVar2 = Abc_MaxInt(s->var_inc,0x10);
  s->var_inc = iVar2;
  return;
}

Assistant:

static inline void act_var_rescale(sat_solver* s) {
    unsigned* activity = s->activity;
    int i;
    for (i = 0; i < s->size; i++)
        activity[i] >>= 19;
    s->var_inc >>= 19;
    s->var_inc = Abc_MaxInt( s->var_inc, (1<<4) );
}